

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rangeproof_impl.h
# Opt level: O0

int secp256k1_rangeproof_getheader_impl
              (size_t *offset,int *exp,int *mantissa,uint64_t *scale,uint64_t *min_value,
              uint64_t *max_value,uchar *proof,size_t plen)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  int has_min;
  int has_nz_range;
  int i;
  uint64_t *max_value_local;
  uint64_t *min_value_local;
  uint64_t *scale_local;
  int *mantissa_local;
  int *exp_local;
  size_t *offset_local;
  
  if ((plen < 0x41) || ((proof[*offset] & 0x80) != 0)) {
    return 0;
  }
  bVar1 = proof[*offset];
  bVar2 = proof[*offset];
  *exp = -1;
  *mantissa = 0;
  if ((bVar1 & 0x40) == 0) {
    *max_value = 0;
  }
  else {
    *exp = proof[*offset] & 0x1f;
    *offset = *offset + 1;
    if (0x12 < *exp) {
      return 0;
    }
    *mantissa = proof[*offset] + 1;
    if (0x40 < *mantissa) {
      return 0;
    }
    *max_value = 0xffffffffffffffff >> (0x40U - (char)*mantissa & 0x3f);
  }
  *offset = *offset + 1;
  *scale = 1;
  for (has_min = 0; has_min < *exp; has_min = has_min + 1) {
    if (0x1999999999999999 < *max_value) {
      return 0;
    }
    *max_value = *max_value * 10;
    *scale = *scale * 10;
  }
  *min_value = 0;
  if ((bVar2 & 0x20) != 0) {
    if (plen - *offset < 8) {
      return 0;
    }
    for (has_min = 0; has_min < 8; has_min = has_min + 1) {
      *min_value = *min_value << 8 | (ulong)proof[*offset + (long)has_min];
    }
    *offset = *offset + 8;
  }
  bVar3 = *max_value <= -*min_value - 1;
  if (bVar3) {
    *max_value = *min_value + *max_value;
  }
  offset_local._4_4_ = (uint)bVar3;
  return offset_local._4_4_;
}

Assistant:

SECP256K1_INLINE static int secp256k1_rangeproof_getheader_impl(size_t *offset, int *exp, int *mantissa, uint64_t *scale,
 uint64_t *min_value, uint64_t *max_value, const unsigned char *proof, size_t plen) {
    int i;
    int has_nz_range;
    int has_min;
    if (plen < 65 || ((proof[*offset] & 128) != 0)) {
        return 0;
    }
    has_nz_range = proof[*offset] & 64;
    has_min = proof[*offset] & 32;
    *exp = -1;
    *mantissa = 0;
    if (has_nz_range) {
        *exp = proof[*offset] & 31;
        *offset += 1;
        if (*exp > 18) {
           return 0;
        }
        *mantissa = proof[*offset] + 1;
        if (*mantissa > 64) {
            return 0;
         }
        *max_value = UINT64_MAX>>(64-*mantissa);
    } else {
        *max_value = 0;
    }
    *offset += 1;
    *scale = 1;
    for (i = 0; i < *exp; i++) {
        if (*max_value > UINT64_MAX / 10) {
            return 0;
        }
        *max_value *= 10;
        *scale *= 10;
    }
    *min_value = 0;
    if (has_min) {
        if(plen - *offset < 8) {
            return 0;
        }
        /*FIXME: Compact minvalue encoding?*/
        for (i = 0; i < 8; i++) {
            *min_value = (*min_value << 8) | proof[*offset + i];
        }
        *offset += 8;
    }
    if (*max_value > UINT64_MAX - *min_value) {
        return 0;
    }
    *max_value += *min_value;
    return 1;
}